

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arith.hpp
# Opt level: O1

size_t arith_decompress(uint32_t *obuff,size_t osize,uint8_t *ibuff,size_t isize)

{
  size_type __n;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  int offset;
  uint32_t uVar4;
  ulong uVar5;
  size_t sVar6;
  ulong uVar7;
  size_t sVar8;
  byte *pbVar9;
  allocator_type *__a;
  ulong uVar10;
  int extraout_EDX;
  int extraout_EDX_00;
  int silent;
  uint uVar11;
  ulong uVar12;
  uint uVar13;
  ulong uVar14;
  size_t sVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint64_t newv;
  long lVar19;
  vector<unsigned_int,_std::allocator<unsigned_int>_> F;
  allocator_type local_69;
  size_t local_68;
  size_t local_60;
  uint32_t *local_58;
  value_type local_4c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_48;
  
  uVar5 = 0;
  lVar19 = 0;
  pbVar9 = ibuff;
  do {
    lVar19 = lVar19 + ((ulong)*pbVar9 << (uVar5 & 0x3f));
    uVar5 = uVar5 + 8;
    pbVar9 = pbVar9 + 1;
  } while (uVar5 != 0x20);
  auVar3 = vpmovzxbq_avx2(ZEXT416(*(uint *)(ibuff + 4)));
  auVar3 = vpsllvq_avx2(auVar3,_DAT_001a9240);
  auVar1 = vpor_avx(auVar3._0_16_,auVar3._16_16_);
  auVar2 = vpshufd_avx(auVar1,0xee);
  auVar1 = vpaddq_avx(auVar1,auVar2);
  __n = lVar19 + 2;
  local_4c = 0;
  __a = &local_69;
  local_68 = isize;
  local_60 = osize;
  local_58 = obuff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_48,__n,&local_4c,__a);
  if (auVar1._0_8_ + 1U < 1000) {
    sVar6 = interp_decompress(local_48.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start,__n,ibuff + 8,(size_t)__a);
    silent = extraout_EDX;
  }
  else {
    sVar6 = arith_decompress(local_48.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start,__n,ibuff + 8,local_68 - 8);
    silent = extraout_EDX_00;
  }
  uVar5 = lVar19 + 1;
  scale_counts(&local_48,uVar5,silent);
  *local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 0;
  if (uVar5 != 0) {
    uVar4 = *local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar10 = 0;
    do {
      uVar4 = uVar4 + local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar10 + 1];
      local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start[uVar10 + 1] = uVar4;
      uVar10 = uVar10 + 1;
    } while (uVar5 != uVar10);
  }
  lVar19 = 0;
  uVar10 = 0;
  do {
    uVar10 = (ulong)ibuff[lVar19 + sVar6 + 8] | uVar10 << 8;
    lVar19 = lVar19 + 1;
  } while ((int)lVar19 != 7);
  sVar6 = sVar6 + 0xf;
  if (local_60 != 0) {
    uVar12 = 0xffffffffffffff;
    sVar15 = 0;
    uVar14 = 0;
    do {
      uVar18 = uVar12 >> 0x1f;
      uVar7 = uVar10 / uVar18;
      if (0x7ffffffe < uVar7) {
        uVar7 = 0x7fffffff;
      }
      if (0 < (int)uVar5) {
        uVar11 = 0;
        uVar16 = uVar5 & 0xffffffff;
        do {
          uVar13 = uVar11 + 1 + (int)uVar16 >> 1;
          uVar14 = (ulong)uVar13;
          uVar17 = uVar14;
          if ((local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start[uVar14 - 1] <= uVar7) &&
             (uVar17 = uVar16, uVar11 = uVar13,
             (uint)uVar7 <
             local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[uVar14])) break;
          uVar16 = uVar17;
        } while ((int)uVar11 < (int)uVar17);
      }
      local_58[sVar15] = (int)uVar14 - 1;
      lVar19 = uVar18 * local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar14 - 1];
      uVar10 = uVar10 - lVar19;
      uVar12 = uVar12 - lVar19;
      if (-1 < (int)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start[uVar14]) {
        uVar12 = ((ulong)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_start[uVar14] -
                 (ulong)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start[uVar14 - 1]) * uVar18;
      }
      if (uVar12 >> 0x30 == 0) {
        sVar8 = local_68;
        uVar7 = uVar12;
        if (local_68 < sVar6) {
          sVar8 = sVar6;
        }
        do {
          if (sVar8 == sVar6) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"I/O error",9);
            std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
            exit(1);
          }
          uVar12 = uVar7 << 8;
          pbVar9 = ibuff + sVar6;
          sVar6 = sVar6 + 1;
          uVar10 = (uVar10 & 0xffffffffffff) << 8 | (ulong)*pbVar9;
          uVar18 = uVar7 >> 0x28;
          uVar7 = uVar12;
        } while (uVar18 == 0);
      }
      sVar15 = sVar15 + 1;
    } while (sVar15 != local_60);
  }
  operator_delete(local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_48.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start);
  return sVar6;
}

Assistant:

size_t arith_decompress(uint32_t* obuff, /* output buffer */
    size_t osize, /* number symbols to be decoded */
    const uint8_t* ibuff, /* input buffer */
    size_t isize)
{ /* size of input buffer */

    int i;
    size_t op, ip = 0;

    /* state variables for decoding */
    uint64_t R = FULL;
    uint64_t D;
    uint64_t low, high, total, scale;
    uint64_t target;
    uint64_t v = 0;
    size_t maxv;
    size_t nunq;

    /* fetch the prelude */
    ip += byte_decode(ibuff + ip, isize - ip, (1LL << 31), &target);
    maxv = target;
    ip += byte_decode(ibuff + ip, isize - ip, (1LL << 31), &target);
    nunq = target;

    std::vector<uint32_t> F(maxv + 1, 0);

    if (nunq < PREL_RECURSE) {
        /* small enough that inefficient approach is ok */
        ip += interp_decompress(F.data(), maxv + 1, ibuff + ip, isize - ip);
    } else {
        /* or else, tadaa, recursive call for prelude... */
        ip += arith_decompress(F.data(), maxv + 1, ibuff + ip, isize - ip);
    }

    /* adjust and scale the counts like the encoder did */
    total = scale_counts(F, maxv, 1);

    /* convert to cumulative sums */
    F[0] = 0;
    for (i = 1; i <= maxv; i++) {
        F[i] = F[i - 1] + F[i];
    }

    /* load up D */
    D = 0;
    for (i = 0; i < BBYTES; i++) {
        D <<= 8;
        D += ibuff[ip++];
    }

    /* and decode the required symbols one by one */
    for (op = 0; op < osize; op++) {
        /* decode target */
        scale = R >> TBTS;
        target = D / scale;

        /* beware of the rounding that might accrue at the top of the
                   range, and adjust downward if required */
        if (target >= total)
            target = total - 1;
        /* binary search in F for target is a little faster */
        {
            int lo = 0, hi = maxv;
            /* elements F[lo..hi] inclusive being considered */
            while (lo < hi) {
                v = (1 + lo + hi) >> 1;
                if (F[v - 1] > target) {
                    hi = v;
                } else if (target >= F[v]) {
                    lo = v;
                } else {
                    break;
                }
            }
        }

        /* (could also take leading bits of target to index a table
                   and accelerate the search, leave that for another day)
                */
        obuff[op] = v - 1;

        /* adjust, tracing the encoder, with D=V-L throughout */
        low = F[v - 1];
        high = F[v];
        D -= low * scale;
        if (high < total) {
            R = (high - low) * scale;
        } else {
            R = R - low * scale;
        }

        while (R < PART) {
            if (ip >= isize) {
                std::cerr << "I/O error" << std::endl;
                exit(EXIT_FAILURE);
            }
            /* range has shrunk, time to bring in another byte */
            R <<= 8;
            D <<= 8;
            D &= FULL;
            D += ibuff[ip++];
        }
    }
    return ip;
}